

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Point2f __thiscall pbrt::ZSobolSampler::Get2D(ZSobolSampler *this)

{
  CranleyPattersonRotator randomizer;
  uint64_t a;
  uint64_t uVar1;
  CranleyPattersonRotator randomizer_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar6 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar7 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar8 [64];
  undefined1 local_28 [16];
  undefined1 auVar2 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  
  a = GetSampleIndex(this);
  uVar1 = MixBits((long)(this->seed ^ this->dimension));
  this->dimension = this->dimension + 2;
  randomizer.delta = (uint32_t)uVar1;
  randomizer_00.delta = (uint32_t)(uVar1 >> 0x20);
  switch(this->randomizeStrategy) {
  case None:
    auVar3._0_4_ = SobolSampleFloat<pbrt::NoRandomizer>(a,0);
    auVar3._4_60_ = extraout_var;
    local_28 = auVar3._0_16_;
    auVar4._0_4_ = SobolSampleFloat<pbrt::NoRandomizer>(a,1);
    auVar4._4_60_ = extraout_var_00;
    auVar2 = auVar4._0_16_;
    break;
  case CranleyPatterson:
    local_28._0_4_ = SobolSampleFloat<pbrt::CranleyPattersonRotator>(a,0,randomizer);
    local_28._4_4_ = extraout_XMM0_Db_01;
    local_28._8_4_ = extraout_XMM0_Dc_01;
    local_28._12_4_ = extraout_XMM0_Dd_01;
    auVar7._0_4_ = SobolSampleFloat<pbrt::CranleyPattersonRotator>(a,1,randomizer_00);
    auVar7._4_60_ = extraout_var_03;
    auVar2 = auVar7._0_16_;
    break;
  case PermuteDigits:
    local_28._0_4_ =
         SobolSampleFloat<pbrt::BinaryPermuteScrambler>
                   (a,0,(BinaryPermuteScrambler)randomizer.delta);
    local_28._4_4_ = extraout_XMM0_Db;
    local_28._8_4_ = extraout_XMM0_Dc;
    local_28._12_4_ = extraout_XMM0_Dd;
    auVar5._0_4_ = SobolSampleFloat<pbrt::BinaryPermuteScrambler>
                             (a,1,(BinaryPermuteScrambler)randomizer_00.delta);
    auVar5._4_60_ = extraout_var_01;
    auVar2 = auVar5._0_16_;
    break;
  case FastOwen:
    local_28._0_4_ =
         SobolSampleFloat<pbrt::FastOwenScrambler>(a,0,(FastOwenScrambler)randomizer.delta);
    local_28._4_4_ = extraout_XMM0_Db_00;
    local_28._8_4_ = extraout_XMM0_Dc_00;
    local_28._12_4_ = extraout_XMM0_Dd_00;
    auVar6._0_4_ = SobolSampleFloat<pbrt::FastOwenScrambler>
                             (a,1,(FastOwenScrambler)randomizer_00.delta);
    auVar6._4_60_ = extraout_var_02;
    auVar2 = auVar6._0_16_;
    break;
  default:
    local_28._0_4_ = SobolSampleFloat<pbrt::OwenScrambler>(a,0,(OwenScrambler)randomizer.delta);
    local_28._4_4_ = extraout_XMM0_Db_02;
    local_28._8_4_ = extraout_XMM0_Dc_02;
    local_28._12_4_ = extraout_XMM0_Dd_02;
    auVar8._0_4_ = SobolSampleFloat<pbrt::OwenScrambler>(a,1,(OwenScrambler)randomizer_00.delta);
    auVar8._4_60_ = extraout_var_04;
    auVar2 = auVar8._0_16_;
  }
  auVar2 = vinsertps_avx(local_28,auVar2,0x10);
  return (Point2f)auVar2._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        uint64_t sampleIndex = GetSampleIndex();
        uint64_t bits = MixBits(dimension ^ seed);
        uint32_t sampleHash[2] = {uint32_t(bits), uint32_t(bits >> 32)};

        dimension += 2;

        if (randomizeStrategy == RandomizeStrategy::None)
            return {SobolSample(sampleIndex, 0, NoRandomizer()),
                    SobolSample(sampleIndex, 1, NoRandomizer())};
        else if (randomizeStrategy == RandomizeStrategy::CranleyPatterson)
            return {SobolSample(sampleIndex, 0, CranleyPattersonRotator(sampleHash[0])),
                    SobolSample(sampleIndex, 1, CranleyPattersonRotator(sampleHash[1]))};
        else if (randomizeStrategy == RandomizeStrategy::PermuteDigits)
            return {SobolSample(sampleIndex, 0, BinaryPermuteScrambler(sampleHash[0])),
                    SobolSample(sampleIndex, 1, BinaryPermuteScrambler(sampleHash[1]))};
        else if (randomizeStrategy == RandomizeStrategy::FastOwen)
            return {SobolSample(sampleIndex, 0, FastOwenScrambler(sampleHash[0])),
                    SobolSample(sampleIndex, 1, FastOwenScrambler(sampleHash[1]))};
        else
            return {SobolSample(sampleIndex, 0, OwenScrambler(sampleHash[0])),
                    SobolSample(sampleIndex, 1, OwenScrambler(sampleHash[1]))};
    }